

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntryMerge(RowSetEntry *pA,RowSetEntry *pB)

{
  RowSetEntry *pRVar1;
  RowSetEntry *local_38;
  RowSetEntry *pTail;
  RowSetEntry head;
  RowSetEntry *pB_local;
  RowSetEntry *pA_local;
  
  local_38 = (RowSetEntry *)&pTail;
  head.pLeft = pB;
  pB_local = pA;
  do {
    while (pRVar1 = head.pLeft, (head.pLeft)->v < pB_local->v) {
      local_38->pRight = head.pLeft;
      local_38 = pRVar1;
      head.pLeft = (head.pLeft)->pRight;
      if (head.pLeft == (RowSetEntry *)0x0) {
        pRVar1->pRight = pB_local;
        return (RowSetEntry *)head.v;
      }
    }
    if (pB_local->v < (head.pLeft)->v) {
      local_38->pRight = pB_local;
      local_38 = pB_local;
    }
    pB_local = pB_local->pRight;
  } while (pB_local != (RowSetEntry *)0x0);
  local_38->pRight = head.pLeft;
  return (RowSetEntry *)head.v;
}

Assistant:

static struct RowSetEntry *rowSetEntryMerge(
  struct RowSetEntry *pA,    /* First sorted list to be merged */
  struct RowSetEntry *pB     /* Second sorted list to be merged */
){
  struct RowSetEntry head;
  struct RowSetEntry *pTail;

  pTail = &head;
  assert( pA!=0 && pB!=0 );
  for(;;){
    assert( pA->pRight==0 || pA->v<=pA->pRight->v );
    assert( pB->pRight==0 || pB->v<=pB->pRight->v );
    if( pA->v<=pB->v ){
      if( pA->v<pB->v ) pTail = pTail->pRight = pA;
      pA = pA->pRight;
      if( pA==0 ){
        pTail->pRight = pB;
        break;
      }
    }else{
      pTail = pTail->pRight = pB;
      pB = pB->pRight;
      if( pB==0 ){
        pTail->pRight = pA;
        break;
      }
    }
  }
  return head.pRight;
}